

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

size_t bitset_extract_setbits_sse_uint16
                 (uint64_t *words,size_t length,uint16_t *out,size_t outcapacity,uint16_t base)

{
  undefined1 (*pauVar1) [16];
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  short sVar6;
  undefined1 (*pauVar7) [16];
  byte bVar9;
  ulong uVar8;
  int iVar10;
  ulong uVar11;
  uint64_t uVar12;
  bool bVar13;
  undefined2 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar16 [64];
  
  uVar14 = (undefined2)(base - 1);
  auVar16 = ZEXT1664(CONCAT214(uVar14,CONCAT212(uVar14,CONCAT210(uVar14,CONCAT28(uVar14,CONCAT26(
                                                  uVar14,CONCAT24(uVar14,CONCAT22(uVar14,uVar14)))))
                                               )));
  pauVar1 = (undefined1 (*) [16])(out + outcapacity);
  uVar11 = 0;
  auVar17._8_2_ = 0x40;
  auVar17._0_8_ = 0x40004000400040;
  auVar17._10_2_ = 0x40;
  auVar17._12_2_ = 0x40;
  auVar17._14_2_ = 0x40;
  auVar18._8_2_ = 8;
  auVar18._0_8_ = 0x8000800080008;
  auVar18._10_2_ = 8;
  auVar18._12_2_ = 8;
  auVar18._14_2_ = 8;
  auVar19._8_2_ = 0x10;
  auVar19._0_8_ = 0x10001000100010;
  auVar19._10_2_ = 0x10;
  auVar19._12_2_ = 0x10;
  auVar19._14_2_ = 0x10;
  pauVar7 = (undefined1 (*) [16])out;
  while ((uVar11 < length && (pauVar7 + 2 <= pauVar1))) {
    uVar8 = words[uVar11];
    if (uVar8 == 0) {
      auVar4 = vpaddw_avx(auVar16._0_16_,auVar17);
      auVar16 = ZEXT1664(auVar4);
    }
    else {
      iVar10 = 4;
      while (bVar13 = iVar10 != 0, iVar10 = iVar10 + -1, bVar13) {
        bVar9 = (byte)(uVar8 >> 8);
        bVar2 = ""[uVar8 & 0xff];
        bVar3 = ""[bVar9];
        auVar15 = auVar16._0_16_;
        auVar4 = vpaddw_avx(auVar15,*(undefined1 (*) [16])
                                     ((long)vecDecodeTable_uint16[0] +
                                     (ulong)(uint)((int)(uVar8 & 0xff) << 4)));
        auVar5 = vpaddw_avx(auVar15,(undefined1  [16])vecDecodeTable_uint16[bVar9]);
        uVar8 = uVar8 >> 0x10;
        auVar5 = vpaddw_avx(auVar5,auVar18);
        auVar15 = vpaddw_avx(auVar15,auVar19);
        auVar16 = ZEXT1664(auVar15);
        *pauVar7 = auVar4;
        *(undefined1 (*) [16])(*pauVar7 + (ulong)bVar2 * 2) = auVar5;
        pauVar7 = (undefined1 (*) [16])
                  (*(undefined1 (*) [16])(*pauVar7 + (ulong)bVar2 * 2) + (ulong)bVar3 * 2);
      }
    }
    uVar11 = uVar11 + 1;
  }
  iVar10 = (uint)base + (int)uVar11 * 0x40;
  while ((uVar11 < length && (pauVar7 < pauVar1))) {
    uVar12 = words[uVar11];
    for (; (uVar12 != 0 && (pauVar7 < pauVar1)); pauVar7 = (undefined1 (*) [16])(*pauVar7 + 2)) {
      sVar6 = 0;
      for (uVar8 = uVar12; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
        sVar6 = sVar6 + 1;
      }
      *(short *)*pauVar7 = sVar6 + (short)iVar10;
      uVar12 = uVar12 - 1 & uVar12;
    }
    iVar10 = iVar10 + 0x40;
    uVar11 = uVar11 + 1;
  }
  return (long)pauVar7 - (long)out >> 1;
}

Assistant:

CROARING_TARGET_AVX2
size_t bitset_extract_setbits_sse_uint16(const uint64_t *words, size_t length,
                                         uint16_t *out, size_t outcapacity,
                                         uint16_t base) {
    uint16_t *initout = out;
    __m128i baseVec = _mm_set1_epi16(base - 1);
    __m128i incVec = _mm_set1_epi16(64);
    __m128i add8 = _mm_set1_epi16(8);
    uint16_t *safeout = out + outcapacity;
    const int numberofbytes = 2;  // process two bytes at a time
    size_t i = 0;
    for (; (i < length) && (out + numberofbytes * 8 <= safeout); ++i) {
        uint64_t w = words[i];
        if (w == 0) {
            baseVec = _mm_add_epi16(baseVec, incVec);
        } else {
            for (int k = 0; k < 4; ++k) {
                uint8_t byteA = (uint8_t)w;
                uint8_t byteB = (uint8_t)(w >> 8);
                w >>= 16;
                __m128i vecA = _mm_load_si128(
                    (const __m128i *)vecDecodeTable_uint16[byteA]);
                __m128i vecB = _mm_load_si128(
                    (const __m128i *)vecDecodeTable_uint16[byteB]);
                uint8_t advanceA = lengthTable[byteA];
                uint8_t advanceB = lengthTable[byteB];
                vecA = _mm_add_epi16(baseVec, vecA);
                baseVec = _mm_add_epi16(baseVec, add8);
                vecB = _mm_add_epi16(baseVec, vecB);
                baseVec = _mm_add_epi16(baseVec, add8);
                _mm_storeu_si128((__m128i *)out, vecA);
                out += advanceA;
                _mm_storeu_si128((__m128i *)out, vecB);
                out += advanceB;
            }
        }
    }
    base += (uint16_t)(i * 64);
    for (; (i < length) && (out < safeout); ++i) {
        uint64_t w = words[i];
        while ((w != 0) && (out < safeout)) {
            uint64_t t = w & (~w + 1);
            int r = __builtin_ctzll(w);
            *out = r + base;
            out++;
            w ^= t;
        }
        base += 64;
    }
    return out - initout;
}